

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
cnn::LookupParameters::Initialize
          (LookupParameters *this,uint index,vector<float,_std::allocator<float>_> *val)

{
  float *__dest;
  uint uVar1;
  size_type sVar2;
  reference pvVar3;
  const_reference __src;
  vector<float,_std::allocator<float>_> *in_RDX;
  uint in_ESI;
  long in_RDI;
  Dim *in_stack_ffffffffffffffd0;
  
  sVar2 = std::vector<float,_std::allocator<float>_>::size(in_RDX);
  uVar1 = Dim::size(in_stack_ffffffffffffffd0);
  if ((uint)sVar2 == uVar1) {
    pvVar3 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                       ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)(in_RDI + 0x30),
                        (ulong)in_ESI);
    __dest = pvVar3->v;
    __src = std::vector<float,_std::allocator<float>_>::operator[](in_RDX,0);
    sVar2 = std::vector<float,_std::allocator<float>_>::size(in_RDX);
    memcpy(__dest,__src,sVar2 << 2);
    return;
  }
  __assert_fail("int(val.size()) == int(dim.size())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/model.cc"
                ,99,"void cnn::LookupParameters::Initialize(unsigned int, const vector<float> &)");
}

Assistant:

void LookupParameters::Initialize(unsigned index, const vector<float>& val) {
  assert(int(val.size()) == int(dim.size()));
#if HAVE_CUDA
  cerr << "implement LookupParameters::Initialize\n";
  throw cuda_not_implemented("LookupParameters::Initialize");
#else
  memcpy(values[index].v, &val[0], val.size() * sizeof(float));
#endif
}